

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

GeoPoly * geopolyBBox(sqlite3_context *context,sqlite3_value *pPoly,RtreeCoord *aCoord,int *pRc)

{
  float fVar1;
  float fVar2;
  GeoPoly *pGVar3;
  int *in_RCX;
  sqlite3_value *in_RDX;
  sqlite3_context *in_RSI;
  long in_RDI;
  double r;
  int ii;
  float mxY;
  float mnY;
  float mxX;
  float mnX;
  GeoPoly *p;
  GeoPoly *pOut;
  void *in_stack_ffffffffffffffa8;
  int local_4c;
  float local_48;
  float local_44;
  float local_40;
  float local_3c;
  
  if ((in_RSI == (sqlite3_context *)0x0) && (in_RDX != (sqlite3_value *)0x0)) {
    local_3c = (float)(in_RDX->u).nZero;
    local_40 = *(GeoCoord *)((long)&in_RDX->u + 4);
    local_44 = *(float *)&in_RDX->z;
    local_48 = *(GeoCoord *)((long)&in_RDX->z + 4);
  }
  else {
    pGVar3 = geopolyFuncParam(in_RSI,in_RDX,in_RCX);
    if (pGVar3 == (GeoPoly *)0x0) {
      if (in_RDX == (sqlite3_value *)0x0) {
        return (GeoPoly *)0x0;
      }
      memset(in_RDX,0,0x10);
      return (GeoPoly *)0x0;
    }
    local_40 = pGVar3->a[0];
    local_48 = pGVar3->a[1];
    local_44 = local_48;
    local_3c = local_40;
    for (local_4c = 1; local_4c < pGVar3->nVertex; local_4c = local_4c + 1) {
      fVar1 = pGVar3->a[local_4c << 1];
      fVar2 = fVar1;
      if ((local_3c <= fVar1) && (fVar2 = local_3c, local_40 < fVar1)) {
        local_40 = fVar1;
      }
      local_3c = fVar2;
      fVar1 = pGVar3->a[local_4c * 2 + 1];
      in_stack_ffffffffffffffa8 = (void *)(double)fVar1;
      fVar2 = fVar1;
      if (((double)local_44 <= (double)in_stack_ffffffffffffffa8) &&
         (fVar2 = local_44, (double)local_48 < (double)in_stack_ffffffffffffffa8)) {
        local_48 = fVar1;
      }
      local_44 = fVar2;
    }
    if (in_RCX != (int *)0x0) {
      *in_RCX = 0;
    }
    if (in_RDX != (sqlite3_value *)0x0) {
      sqlite3_free((void *)0x2a2b3e);
      *(float *)&in_RDX->u = local_3c;
      *(float *)((long)&in_RDX->u + 4) = local_40;
      *(float *)&in_RDX->z = local_44;
      *(float *)((long)&in_RDX->z + 4) = local_48;
      return (GeoPoly *)0x0;
    }
  }
  pGVar3 = (GeoPoly *)sqlite3_realloc64(in_stack_ffffffffffffffa8,0x2a2a2e);
  if (pGVar3 != (GeoPoly *)0x0) {
    pGVar3->nVertex = 4;
    pGVar3->hdr[0] = '\x01';
    pGVar3->hdr[1] = '\0';
    pGVar3->hdr[2] = '\0';
    pGVar3->hdr[3] = '\x04';
    pGVar3->a[0] = local_3c;
    pGVar3->a[1] = local_44;
    pGVar3->a[2] = local_40;
    pGVar3->a[3] = local_44;
    pGVar3->a[4] = local_40;
    pGVar3->a[5] = local_48;
    pGVar3->a[6] = local_3c;
    pGVar3->a[7] = local_48;
    return pGVar3;
  }
  sqlite3_free((void *)0x2a2a45);
  if (in_RDI != 0) {
    sqlite3_result_error_nomem((sqlite3_context *)0x2a2a57);
  }
  if (in_RCX != (int *)0x0) {
    *in_RCX = 7;
  }
  return (GeoPoly *)0x0;
}

Assistant:

static GeoPoly *geopolyBBox(
  sqlite3_context *context,   /* For recording the error */
  sqlite3_value *pPoly,       /* The polygon */
  RtreeCoord *aCoord,         /* Results here */
  int *pRc                    /* Error code here */
){
  GeoPoly *pOut = 0;
  GeoPoly *p;
  float mnX, mxX, mnY, mxY;
  if( pPoly==0 && aCoord!=0 ){
    p = 0;
    mnX = aCoord[0].f;
    mxX = aCoord[1].f;
    mnY = aCoord[2].f;
    mxY = aCoord[3].f;
    goto geopolyBboxFill;
  }else{
    p = geopolyFuncParam(context, pPoly, pRc);
  }
  if( p ){
    int ii;
    mnX = mxX = GeoX(p,0);
    mnY = mxY = GeoY(p,0);
    for(ii=1; ii<p->nVertex; ii++){
      double r = GeoX(p,ii);
      if( r<mnX ) mnX = (float)r;
      else if( r>mxX ) mxX = (float)r;
      r = GeoY(p,ii);
      if( r<mnY ) mnY = (float)r;
      else if( r>mxY ) mxY = (float)r;
    }
    if( pRc ) *pRc = SQLITE_OK;
    if( aCoord==0 ){
      geopolyBboxFill:
      pOut = sqlite3_realloc64(p, GEOPOLY_SZ(4));
      if( pOut==0 ){
        sqlite3_free(p);
        if( context ) sqlite3_result_error_nomem(context);
        if( pRc ) *pRc = SQLITE_NOMEM;
        return 0;
      }
      pOut->nVertex = 4;
      ii = 1;
      pOut->hdr[0] = *(unsigned char*)&ii;
      pOut->hdr[1] = 0;
      pOut->hdr[2] = 0;
      pOut->hdr[3] = 4;
      GeoX(pOut,0) = mnX;
      GeoY(pOut,0) = mnY;
      GeoX(pOut,1) = mxX;
      GeoY(pOut,1) = mnY;
      GeoX(pOut,2) = mxX;
      GeoY(pOut,2) = mxY;
      GeoX(pOut,3) = mnX;
      GeoY(pOut,3) = mxY;
    }else{
      sqlite3_free(p);
      aCoord[0].f = mnX;
      aCoord[1].f = mxX;
      aCoord[2].f = mnY;
      aCoord[3].f = mxY;
    }
  }else if( aCoord ){
    memset(aCoord, 0, sizeof(RtreeCoord)*4);
  }
  return pOut;
}